

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

FILE_conflict * open_config_file(fnchar *filename)

{
  FILE *__stream;
  FILE *__s;
  int *piVar1;
  char *pcVar2;
  int __errnum;
  
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    piVar1 = __errno_location();
    __errnum = *piVar1;
    if ((__errnum == 0x14) || (__errnum == 2)) {
      __s = fopen(filename,"w");
      if (__s != (FILE *)0x0) goto LAB_00112259;
      __errnum = *piVar1;
    }
    __stream = _stderr;
    pcVar2 = strerror(__errnum);
    __s = (FILE *)0x0;
    fprintf(__stream,"could not open %s: %s",filename,pcVar2);
  }
  else {
LAB_00112259:
    chmod(filename,0x1a4);
    fwrite("# note: this file is rewritten whenever options are changed ingame\n",0x43,1,__s);
  }
  return (FILE_conflict *)__s;
}

Assistant:

static FILE *open_config_file(fnchar *filename)
{
    FILE *fp;

    fp = fopen(filename, "w");
    if (!fp && (errno == ENOTDIR || errno == ENOENT)) {
	fp = fopen(filename, "w");
    }

    if (!fp) {
	fprintf(stderr, "could not open " FN_FMT ": %s", filename, strerror(errno));
	return NULL;
    }

#ifdef UNIX
    chmod(filename, 0644);
#endif

    fprintf(fp, "# note: this file is rewritten whenever options are changed ingame\n");

    return fp;
}